

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtuiohandler_p.cpp
# Opt level: O1

void QTuioHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 in_register_00000034;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      processPackets((QTuioHandler *)_o);
      return;
    case 1:
      process2DCurSource((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 2:
      process2DCurAlive((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 3:
      process2DCurSet((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 4:
      process2DCurFseq((QTuioHandler *)_o,(QOscMessage *)CONCAT44(in_register_00000034,_c));
      return;
    case 5:
      process2DObjSource((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 6:
      process2DObjAlive((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 7:
      process2DObjSet((QTuioHandler *)_o,(QOscMessage *)_a[1]);
      return;
    case 8:
      process2DObjFseq((QTuioHandler *)_o,(QOscMessage *)CONCAT44(in_register_00000034,_c));
      return;
    }
  }
  return;
}

Assistant:

void QTuioHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTuioHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->processPackets(); break;
        case 1: _t->process2DCurSource((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 2: _t->process2DCurAlive((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 3: _t->process2DCurSet((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 4: _t->process2DCurFseq((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 5: _t->process2DObjSource((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 6: _t->process2DObjAlive((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 7: _t->process2DObjSet((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        case 8: _t->process2DObjFseq((*reinterpret_cast< std::add_pointer_t<QOscMessage>>(_a[1]))); break;
        default: ;
        }
    }
}